

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

Sequence ** __thiscall
testing::internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
          (ThreadLocal<testing::Sequence_*> *this)

{
  int iVar1;
  void *__pointer;
  undefined4 extraout_var;
  GTestLog local_1c;
  
  __pointer = pthread_getspecific(this->key_);
  if (__pointer == (void *)0x0) {
    iVar1 = (*((this->default_factory_)._M_t.
               super___uniq_ptr_impl<testing::internal::ThreadLocal<testing::Sequence_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::Sequence_*>::ValueHolderFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::ThreadLocal<testing::Sequence_*>::ValueHolderFactory_*,_std::default_delete<testing::internal::ThreadLocal<testing::Sequence_*>::ValueHolderFactory>_>
               .
               super__Head_base<0UL,_testing::internal::ThreadLocal<testing::Sequence_*>::ValueHolderFactory_*,_false>
              ._M_head_impl)->_vptr_ValueHolderFactory[2])();
    __pointer = (void *)CONCAT44(extraout_var,iVar1);
    iVar1 = pthread_setspecific(this->key_,__pointer);
    if (iVar1 != 0) {
      GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/third_party/googletest/googletest/include/gtest/internal/gtest-port.h"
                         ,0x705);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"pthread_setspecific(key_, holder_base)",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed with error ",0x12);
      std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      GTestLog::~GTestLog(&local_1c);
    }
  }
  return (Sequence **)((long)__pointer + 8);
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != nullptr) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = default_factory_->MakeNewHolder();
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }